

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

Operand * TR_Args(Operand *__return_storage_ptr__,ast *node,bool isPush)

{
  ast *paVar1;
  undefined1 auStack_e8 [48];
  InterCode local_b8;
  
  IrSim::newTmpVar(__return_storage_ptr__,&irSim);
  paVar1 = sibling(node,2);
  TR_Exp(node,__return_storage_ptr__);
  if (paVar1 != (ast *)0x0) {
    paVar1 = child(paVar1,1);
    TR_Args((Operand *)auStack_e8,paVar1,isPush);
    std::__cxx11::string::~string((string *)(auStack_e8 + 8));
  }
  if (isPush) {
    IrSim::icArg(&local_b8,&irSim,__return_storage_ptr__);
    IrSim::commitIc(&irSim,&local_b8);
    InterCode::~InterCode(&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

static Operand TR_Args(ast *node, bool isPush) {
    Operand t1 = irSim.newTmpVar();
    ast *s2 = sibling(node, 2);
    TR_Exp(node, t1);
//    irSim.useLastArrayAddr();
    if (s2) TR_Args(child(s2, 1), isPush);
    if (isPush) irSim << irSim.icArg(t1);
    return t1;
}